

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void os_banner_set_screen_color(void *banner_handle,os_color_t color)

{
  char cVar1;
  int iVar2;
  
  cVar1 = osgen_xlat_color_t(color);
  *(char *)((long)banner_handle + 0x68) = cVar1;
  iVar2 = ossgetcolor(2,(int)cVar1,0,0);
  *(int *)((long)banner_handle + 0x6c) = iVar2;
  if ((S_deferred_redraw == '\0') && ((*(byte *)((long)banner_handle + 4) & 4) == 0)) {
    osgen_redraw_win((osgen_win_t *)banner_handle);
    return;
  }
  return;
}

Assistant:

void os_banner_set_screen_color(void *banner_handle, os_color_t color)
{
    osgen_win_t *win = (osgen_win_t *)banner_handle;

    /* set the new background color in the window */
    win->fillcolor = osgen_xlat_color_t(color);
    win->oss_fillcolor = ossgetcolor(OSGEN_COLOR_TEXT, win->fillcolor, 0, 0);

    /* redraw the window if we don't have a redraw scheduled already */
    if (!S_deferred_redraw && !(win->flags & OSGEN_DEFER_REDRAW))
        osgen_redraw_win(win);
}